

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O0

Query * simplify_subqueries(Query *q)

{
  bool bVar1;
  uint32_t count;
  vector<Query,_std::allocator<Query>_> *queries;
  Query *this;
  Query *in_RSI;
  Query *in_RDI;
  Query *query;
  iterator __end1;
  iterator __begin1;
  Query *in_stack_000000e8;
  vector<Query,_std::allocator<Query>_> *__range1;
  vector<Query,_std::allocator<Query>_> newqueries;
  Query *in_stack_fffffffffffffed8;
  Query *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  Query *in_stack_fffffffffffffef0;
  Query *this_00;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_48 [3];
  vector<Query,_std::allocator<Query>_> *local_30;
  Query *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::vector<Query,_std::allocator<Query>_>::vector
            ((vector<Query,_std::allocator<Query>_> *)0x1aa731);
  local_30 = Query::as_queries(in_stack_fffffffffffffef0);
  local_48[0]._M_current =
       (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_fffffffffffffed8);
  std::vector<Query,_std::allocator<Query>_>::end
            ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> *)
                       in_stack_fffffffffffffee0,
                       (__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> *)
                       in_stack_fffffffffffffed8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::operator*
              (local_48);
    q_optimize(in_stack_000000e8);
    std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
              ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef0,
               (Query *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    Query::~Query(in_stack_fffffffffffffee0);
    __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::operator++
              (local_48);
  }
  queries = (vector<Query,_std::allocator<Query>_> *)Query::get_type(local_10);
  if (*(int *)&(queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
               super__Vector_impl_data._M_start == 4) {
    count = Query::as_count(local_10);
    q_min_of(count,(vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffee0);
  }
  else {
    this = (Query *)Query::get_type(local_10);
    Query::Query(this_00,&in_RDI->type,queries);
    Query::Query(this,in_stack_fffffffffffffed8);
    Query::~Query(this);
  }
  std::vector<Query,_std::allocator<Query>_>::~vector(queries);
  return this_00;
}

Assistant:

Query simplify_subqueries(Query &&q) {
    // q_optimize ensures QueryType is not PRIMITIVE already
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        newqueries.emplace_back(q_optimize(std::move(query)));
    }
    if (q.get_type() == QueryType::MIN_OF) {
        return q_min_of(q.as_count(), std::move(newqueries));
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}